

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O1

int md_analyze_inlines(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,int table_mode)

{
  MD_MARK *pMVar1;
  MD_MARK *pMVar2;
  char cVar3;
  MD_CHAR *pMVar4;
  int i;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  MD_MARK *pMVar9;
  void *pvVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  MD_MARK *pMVar17;
  byte bVar18;
  MD_SIZE MVar19;
  undefined4 in_register_00000014;
  ulong uVar20;
  byte bVar21;
  MD_OFFSET MVar22;
  int iVar23;
  MD_OFFSET MVar24;
  uint uVar25;
  ulong uVar26;
  byte *pbVar27;
  int iVar28;
  MD_MARK *pMVar29;
  ulong uVar30;
  int iVar31;
  uint7 uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  MD_LINE *lines_00;
  MD_OFFSET *pMVar37;
  MD_MARK *pMVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  MD_SIZE *p_size;
  uint in_stack_fffffffffffffe88;
  ulong local_168;
  MD_MARK *local_158;
  ulong local_148;
  ulong local_140;
  uint local_138;
  MD_OFFSET local_134;
  ulong local_130;
  uint local_124;
  MD_OFFSET local_120;
  MD_SIZE tmp_line_index;
  void *local_118;
  ulong local_110;
  undefined8 local_108;
  MD_SIZE title_contents_line_index;
  MD_MARK *local_f8;
  ulong local_f0;
  MD_OFFSET *local_e8;
  MD_MARK *local_e0;
  int local_d4;
  MD_OFFSET title_contents_end;
  MD_OFFSET title_contents_beg;
  long local_c8;
  undefined8 local_c0;
  MD_OFFSET codespan_last_potential_closers [32];
  
  local_108 = CONCAT44(in_register_00000014,n_lines);
  local_148 = (ulong)(uint)table_mode;
  ctx->n_marks = 0;
  codespan_last_potential_closers[0x1c] = 0;
  codespan_last_potential_closers[0x1d] = 0;
  codespan_last_potential_closers[0x1e] = 0;
  codespan_last_potential_closers[0x1f] = 0;
  codespan_last_potential_closers[0x18] = 0;
  codespan_last_potential_closers[0x19] = 0;
  codespan_last_potential_closers[0x1a] = 0;
  codespan_last_potential_closers[0x1b] = 0;
  codespan_last_potential_closers[0x14] = 0;
  codespan_last_potential_closers[0x15] = 0;
  codespan_last_potential_closers[0x16] = 0;
  codespan_last_potential_closers[0x17] = 0;
  codespan_last_potential_closers[0x10] = 0;
  codespan_last_potential_closers[0x11] = 0;
  codespan_last_potential_closers[0x12] = 0;
  codespan_last_potential_closers[0x13] = 0;
  codespan_last_potential_closers[0xc] = 0;
  codespan_last_potential_closers[0xd] = 0;
  codespan_last_potential_closers[0xe] = 0;
  codespan_last_potential_closers[0xf] = 0;
  codespan_last_potential_closers[8] = 0;
  codespan_last_potential_closers[9] = 0;
  codespan_last_potential_closers[10] = 0;
  codespan_last_potential_closers[0xb] = 0;
  codespan_last_potential_closers[4] = 0;
  codespan_last_potential_closers[5] = 0;
  codespan_last_potential_closers[6] = 0;
  codespan_last_potential_closers[7] = 0;
  codespan_last_potential_closers[0] = 0;
  codespan_last_potential_closers[1] = 0;
  codespan_last_potential_closers[2] = 0;
  codespan_last_potential_closers[3] = 0;
  local_d4 = table_mode;
  if (n_lines != 0) {
    local_f0 = (ulong)(n_lines - 1);
    local_e8 = &ctx->html_comment_horizon;
    local_c0 = &ctx->html_proc_instr_horizon;
    local_e0 = (MD_MARK *)&ctx->html_decl_horizon;
    local_f8 = (MD_MARK *)&ctx->html_cdata_horizon;
    iVar23 = 0;
    local_158 = (MD_MARK *)0x0;
    local_130 = local_130 & 0xffffffff00000000;
LAB_00108061:
    lines_00 = lines + (long)local_158;
    uVar8 = (ulong)lines_00->beg;
LAB_00108074:
    uVar6 = lines_00->end;
    uVar20 = (ulong)uVar6;
    uVar12 = (uint)uVar8;
    if ((uint)uVar8 + 3 < uVar6) {
      pMVar4 = ctx->text;
      do {
        uVar13 = (uint)uVar8;
        uVar12 = uVar13;
        if ((((ctx->mark_char_map[(byte)pMVar4[uVar8 & 0xffffffff]] != '\0') ||
             (ctx->mark_char_map[(byte)pMVar4[uVar13 + 1]] != '\0')) ||
            (ctx->mark_char_map[(byte)pMVar4[uVar13 + 2]] != '\0')) ||
           (ctx->mark_char_map[(byte)pMVar4[uVar13 + 3]] != '\0')) break;
        uVar12 = uVar13 + 4;
        uVar8 = (ulong)uVar12;
      } while (uVar13 + 7 < uVar6);
    }
    iVar28 = 6;
    if (uVar12 < uVar6) {
      pMVar4 = ctx->text;
      uVar15 = (ulong)uVar12;
      uVar7 = uVar15 + 1;
      bVar39 = true;
      if (ctx->mark_char_map[(byte)pMVar4[uVar15]] == '\0') {
        do {
          uVar15 = uVar7;
          if (uVar20 == uVar15) {
            uVar8 = (ulong)uVar6;
            goto LAB_00108175;
          }
          uVar7 = uVar15 + 1;
        } while (ctx->mark_char_map[(byte)pMVar4[uVar15]] == '\0');
        bVar39 = uVar15 < uVar20;
      }
      uVar8 = uVar15;
      if (!bVar39) goto LAB_00108175;
      uVar12 = (uint)uVar15;
      uVar16 = uVar15 & 0xffffffff;
      bVar21 = pMVar4[uVar16];
      iVar28 = (int)local_158;
      if ((bVar21 != 0x5c) || (ctx->size <= uVar12 + 1)) goto LAB_00108204;
      bVar18 = pMVar4[uVar12 + 1];
      if ((byte)(bVar18 - 0x21) < 0xf) {
        if ((bVar18 != 0xd) && (bVar18 != 10)) {
LAB_001081ba:
          pMVar9 = md_add_mark(ctx);
          if (pMVar9 != (MD_MARK *)0x0) {
            pMVar9->beg = uVar12;
            pMVar9->end = uVar12 + 2;
            pMVar9->prev = -1;
            pMVar9->next = -1;
            pMVar9->ch = '\\';
            pMVar9->flags = '\x10';
            goto LAB_001081ea;
          }
LAB_00108fb5:
          iVar23 = -1;
          iVar28 = 0xf;
          goto LAB_00108175;
        }
LAB_00108164:
        if (iVar28 + 1U < (uint)local_108) goto LAB_001081ba;
LAB_001081ea:
        local_168 = (ulong)(uVar12 + 2);
      }
      else {
        if (bVar18 < 0x5b) {
          if (6 < bVar18 - 0x3a) {
            if ((bVar18 == 10) || (bVar18 == 0xd)) goto LAB_00108164;
            goto LAB_00108204;
          }
          goto LAB_001081ba;
        }
        uVar13 = bVar18 - 0x5b;
        if ((uVar13 < 0x24) && ((0xf0000003fU >> ((ulong)uVar13 & 0x3f) & 1) != 0))
        goto LAB_001081ba;
LAB_00108204:
        uVar14 = (uint)bVar21;
        uVar13 = (uint)bVar21;
        if (bVar21 < 0x2e) {
          if (uVar14 == 0x21) {
            if ((uVar12 + 1 < uVar6) && (iVar28 = 2, pMVar4[uVar12 + 1] == '[')) {
LAB_00108299:
              pMVar9 = md_add_mark(ctx);
              if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108a05;
              uVar6 = iVar28 + uVar12;
              pMVar9->beg = uVar12;
              pMVar9->end = uVar6;
              pMVar9->prev = -1;
              pMVar9->next = -1;
              pMVar9->ch = bVar21;
              pMVar9->flags = '\x01';
              pMVar9 = md_add_mark(ctx);
              if (pMVar9 != (MD_MARK *)0x0) {
                pMVar9->beg = uVar6;
                pMVar9->end = uVar6;
                pMVar9->prev = -1;
                pMVar9->next = -1;
                pMVar9->ch = 'D';
                pMVar9->flags = '\0';
                pMVar9 = md_add_mark(ctx);
                if (pMVar9 != (MD_MARK *)0x0) {
                  pMVar9->beg = uVar6;
                  pMVar9->end = uVar6;
LAB_00108303:
                  pMVar9->prev = -1;
                  pMVar9->next = -1;
                  pMVar9->ch = 'D';
                  pMVar9->flags = '\0';
                  iVar28 = 5;
                  uVar8 = (ulong)uVar6;
                  goto LAB_00108175;
                }
              }
              uVar15 = (ulong)uVar6;
LAB_00108989:
              iVar23 = -1;
              iVar28 = 0xf;
              uVar8 = uVar15;
              goto LAB_00108175;
            }
            if ((uVar13 != 0x3f && 0x3e < bVar21) && (uVar13 == 0x40))
            goto switchD_0010835a_caseD_40;
            goto switchD_00108272_caseD_5c;
          }
          if (uVar14 != 0x26) {
            if (uVar14 == 0x2a) goto switchD_00108272_caseD_5f;
            goto switchD_00108272_caseD_5c;
          }
          pMVar9 = md_add_mark(ctx);
          if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108fb5;
          pMVar9->beg = uVar12;
          uVar8 = (ulong)(uVar12 + 1);
          pMVar9->end = uVar12 + 1;
          pMVar9->prev = -1;
          pMVar9->next = -1;
          pMVar9->ch = bVar21;
          pMVar9->flags = '\x01';
LAB_00108dde:
          iVar28 = 5;
          goto LAB_00108175;
        }
        switch(bVar21) {
        case 0x3a:
          lVar11 = 0x18;
          iVar31 = iVar23;
          do {
            uVar6 = *(uint *)((long)&md_get_unicode_fold_info::FOLD_MAP_LIST[2].map_size + lVar11);
            iVar28 = 0;
            uVar12 = (uint)uVar15;
            iVar23 = iVar31;
            if (lines_00->beg + uVar6 <= uVar12) {
              pvVar10 = *(void **)((long)&md_get_unicode_fold_info::FOLD_MAP_LIST[2].n_codepoints +
                                  lVar11);
              uVar13 = *(uint *)(md_collect_marks_scheme_map + lVar11);
              pMVar4 = ctx->text;
              iVar28 = bcmp(pMVar4 + (uVar12 - uVar6),
                            *(void **)((long)&md_get_unicode_fold_info::FOLD_MAP_LIST[2].data +
                                      lVar11),(ulong)uVar6);
              if ((iVar28 == 0) && (uVar14 = uVar13 + uVar12 + 1, uVar14 < lines_00->end)) {
                local_110 = CONCAT44(local_110._4_4_,uVar14);
                iVar28 = bcmp(pMVar4 + (uVar12 + 1),pvVar10,(ulong)uVar13);
                if (iVar28 == 0) {
                  pMVar9 = md_add_mark(ctx);
                  iVar28 = 0xf;
                  iVar23 = -1;
                  if (pMVar9 != (MD_MARK *)0x0) {
                    pMVar9->beg = uVar12 - uVar6;
                    pMVar9->end = (MD_OFFSET)local_110;
                    pMVar9->prev = -1;
                    pMVar9->next = -1;
                    pMVar9->ch = bVar21;
                    pMVar9->flags = '\x01';
                    pMVar9 = md_add_mark(ctx);
                    iVar28 = 0xf;
                    if (pMVar9 != (MD_MARK *)0x0) {
                      MVar22 = lines_00->end;
                      pMVar9->beg = lines_00->beg;
                      pMVar9->end = MVar22;
                      pMVar9->prev = -1;
                      pMVar9->next = -1;
                      pMVar9->ch = 'D';
                      pMVar9->flags = '\0';
                      iVar28 = 0x55;
                      uVar15 = local_110 & 0xffffffff;
                      iVar23 = iVar31;
                    }
                  }
                  goto LAB_0010846b;
                }
              }
              iVar28 = 0;
            }
LAB_0010846b:
            if (iVar28 != 0) {
              uVar8 = uVar15;
              if (iVar28 != 0x55) goto LAB_00108175;
              break;
            }
            lVar11 = lVar11 + 0x20;
            iVar31 = iVar23;
          } while (lVar11 != 0x78);
          iVar28 = 5;
          uVar8 = (ulong)((int)uVar15 + 1);
          goto LAB_00108175;
        case 0x3b:
          if ((0 < (long)ctx->n_marks) && (ctx->marks[(long)ctx->n_marks + -1].ch == '&')) {
            pMVar9 = md_add_mark(ctx);
            if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108fb5;
            pMVar9->beg = uVar12;
            pMVar9->end = uVar12 + 1;
            pMVar9->prev = -1;
            pMVar9->next = -1;
            pMVar9->ch = bVar21;
            pMVar9->flags = '\x02';
          }
          break;
        case 0x3c:
          if (((ctx->parser).flags & 0x40) == 0) {
            MVar19 = (uint)local_108 - iVar28;
            MVar22 = lines[local_f0].end;
            iVar28 = md_is_html_tag(ctx,lines_00,MVar19,uVar12,MVar22,&tmp_line_index);
            bVar39 = false;
            if (iVar28 == 0) {
              if (((((uVar12 + 4 < lines_00->end) && (pMVar4[uVar12 + 1] == '!')) &&
                   (pMVar4[uVar12 + 2] == '-')) &&
                  ((pMVar4[uVar12 + 3] == '-' &&
                   (iVar28 = md_scan_for_html_closer
                                       (ctx,"-->",3,lines_00,MVar19,uVar12 + 2,MVar22,
                                        &tmp_line_index,local_e8), iVar28 != 0)))) ||
                 ((uVar6 = uVar12 + 2, uVar6 < lines_00->end &&
                  ((ctx->text[uVar12 + 1] == '?' &&
                   (iVar28 = md_scan_for_html_closer
                                       (ctx,"?>",2,lines_00,MVar19,uVar6,MVar22,&tmp_line_index,
                                        local_c0), iVar28 != 0)))))) {
LAB_00109383:
                bVar39 = false;
              }
              else {
                uVar13 = lines_00->end;
                if ((uVar6 < uVar13) &&
                   ((pMVar4 = ctx->text, pMVar4[uVar12 + 1] == '!' &&
                    ((byte)((pMVar4[uVar6] & 0xdfU) + 0xbf) < 0x1a)))) {
                  uVar6 = uVar12 + 3;
                  uVar8 = (ulong)uVar6;
                  if (uVar6 < uVar13) {
                    uVar8 = (ulong)uVar6;
                    do {
                      if (0x19 < (byte)((pMVar4[uVar8] & 0xdfU) + 0xbf)) goto LAB_0010934c;
                      uVar8 = uVar8 + 1;
                    } while (uVar13 != uVar8);
                    uVar8 = (ulong)uVar13;
                  }
LAB_0010934c:
                  iVar28 = md_scan_for_html_closer
                                     (ctx,">",1,lines_00,MVar19,(MD_OFFSET)uVar8,MVar22,
                                      &tmp_line_index,&local_e0->beg);
                  if (iVar28 != 0) goto LAB_00109383;
                }
                bVar39 = true;
                if ((uVar12 + 9 < lines_00->end) &&
                   (ctx->text[uVar16 + 8] == '[' &&
                    *(long *)(ctx->text + uVar16) == 0x41544144435b213c)) {
                  iVar28 = md_scan_for_html_closer
                                     (ctx,"]]>",3,lines_00,MVar19,uVar12 + 9,MVar22,&tmp_line_index,
                                      &local_f8->beg);
                  bVar39 = iVar28 == 0;
                }
              }
            }
            iVar28 = 0;
            pMVar9 = local_158;
            if (!bVar39) {
              pMVar38 = md_add_mark(ctx);
              if (pMVar38 != (MD_MARK *)0x0) {
                pMVar38->beg = uVar12;
                pMVar38->end = uVar12;
                pMVar38->prev = -1;
                pMVar38->next = -1;
                pMVar38->ch = '<';
                pMVar38->flags = '\x14';
                pMVar38 = md_add_mark(ctx);
                if (pMVar38 != (MD_MARK *)0x0) {
                  uVar15 = (ulong)tmp_line_index;
                  pMVar38->beg = tmp_line_index;
                  pMVar38->end = tmp_line_index;
                  pMVar38->prev = -1;
                  pMVar38->next = -1;
                  pMVar38->ch = '>';
                  pMVar38->flags = '\x18';
                  iVar28 = ctx->n_marks;
                  pMVar38 = ctx->marks;
                  pMVar38[(long)iVar28 + -2].next = iVar28 + -1;
                  pMVar38[(long)iVar28 + -1].prev = iVar28 + -2;
                  iVar28 = 5;
                  if (lines_00->end < tmp_line_index) {
                    uVar6 = 0;
                    uVar8 = local_f0;
                    do {
                      iVar31 = (int)uVar8;
                      uVar12 = iVar31 + uVar6 >> 1;
                      pMVar9 = (MD_MARK *)(ulong)uVar12;
                      lines_00 = lines + (long)pMVar9;
                      if (tmp_line_index < lines_00->beg) {
                        if ((iVar31 == 0) || (lines[iVar31 - 1].end < tmp_line_index))
                        goto LAB_00109043;
                        uVar8 = (ulong)(uVar12 - 1);
                      }
                      else {
                        if (tmp_line_index <= lines_00->end) goto LAB_00109043;
                        uVar6 = uVar12 + 1;
                      }
                    } while (uVar6 <= (uint)uVar8);
                    lines_00 = (MD_LINE *)0x0;
                    pMVar9 = local_158;
                  }
                  goto LAB_00109043;
                }
              }
              iVar23 = -1;
              iVar28 = 0xf;
            }
LAB_00109043:
            local_158 = pMVar9;
            uVar8 = uVar15;
            if (!bVar39) goto LAB_00108175;
          }
          uVar6 = lines[local_f0].end;
          MVar22 = (MD_OFFSET)uVar15;
          uVar12 = MVar22 + 1;
          pMVar4 = ctx->text;
          if (uVar12 < uVar6) {
            if ((MVar22 + 2 < uVar6) && (-1 < pMVar4[uVar12])) {
              uVar8 = (ulong)(MVar22 + 2);
              uVar14 = MVar22 + 3;
              uVar13 = 2;
              while (uVar13 < 0x21) {
                bVar21 = pMVar4[uVar8];
                if ((2 < uVar13) && (bVar21 == 0x3a)) {
                  if ((uint)uVar8 < uVar6) {
                    bVar39 = true;
                    goto LAB_00109121;
                  }
                  break;
                }
                if (((9 < (byte)(bVar21 - 0x30)) && (0x19 < (byte)((bVar21 & 0xdf) + 0xbf))) &&
                   ((0x2e < bVar21 || ((0x680000000000U >> ((ulong)(uint)bVar21 & 0x3f) & 1) == 0)))
                   ) break;
                uVar8 = uVar8 + 1;
                uVar13 = uVar13 + 1;
                uVar14 = uVar14 + 1;
                if (uVar6 - MVar22 == uVar13) break;
              }
            }
LAB_00109428:
            bVar39 = true;
            uVar13 = uVar12;
            uVar8 = (ulong)uVar12;
            do {
              bVar21 = pMVar4[uVar8];
              if (((9 < (byte)(bVar21 - 0x30)) && (0x19 < (byte)((bVar21 & 0xdf) + 0xbf))) &&
                 ((uVar14 = uVar13, bVar21 == 0 ||
                  (pvVar10 = memchr(".!#$%&\'*+/=?^_`{|}~-",(int)(char)bVar21,0x15),
                  pvVar10 == (void *)0x0)))) break;
              bVar39 = uVar8 + 1 < (ulong)uVar6;
              uVar13 = uVar13 + 1;
              uVar14 = uVar6;
              uVar8 = uVar8 + 1;
            } while (uVar6 != uVar13);
          }
          else {
            bVar39 = false;
            uVar14 = uVar12;
          }
          bVar41 = true;
          iVar31 = (int)local_118;
          if (((uVar12 < uVar14) && (bVar39)) && (pMVar4[uVar14] == '@')) {
            uVar13 = uVar14 + 1;
            uVar5 = uVar13;
            if (uVar13 < uVar6) {
              uVar5 = uVar6;
            }
            pbVar27 = (byte *)(pMVar4 + uVar13);
            iVar28 = 0;
            do {
              uVar35 = uVar14 + 1;
              uVar34 = uVar5;
              uVar13 = uVar5 - 1;
              if (uVar6 <= uVar35) {
LAB_00109520:
                if (((0 < iVar28) && (uVar35 < uVar6)) && (pMVar4[uVar34] == '>')) {
                  local_168 = (ulong)local_134;
                  if (pMVar4[uVar13] != '-') {
                    iVar31 = 1;
                    bVar41 = false;
                    local_168 = (ulong)(uVar13 + 2);
                  }
                  goto LAB_00109565;
                }
                break;
              }
              bVar21 = *pbVar27;
              if ((((byte)(bVar21 - 0x30) < 10) || ((byte)((bVar21 & 0xdf) + 0xbf) < 0x1a)) ||
                 ((0 < iVar28 && (bVar21 == 0x2d)))) {
                iVar36 = iVar28 + 1;
              }
              else {
                uVar34 = uVar35;
                uVar13 = uVar14;
                if (((iVar28 < 1) || (bVar21 != 0x2e)) || (iVar36 = 0, pMVar4[uVar14] == '-'))
                goto LAB_00109520;
              }
              iVar28 = iVar36;
              pbVar27 = pbVar27 + 1;
              uVar14 = uVar35;
            } while (iVar28 < 0x40);
          }
          local_168 = (ulong)local_134;
LAB_00109565:
          iVar28 = 5;
          MVar24 = (MD_OFFSET)local_168;
          if (bVar41) {
            local_118 = (void *)CONCAT44(local_118._4_4_,iVar31);
            uVar8 = (ulong)uVar12;
            local_134 = MVar24;
            goto LAB_00108175;
          }
          pMVar9 = md_add_mark(ctx);
          if (pMVar9 == (MD_MARK *)0x0) {
            local_118 = (void *)CONCAT44(local_118._4_4_,iVar31);
            local_134 = MVar24;
LAB_00108a05:
            iVar28 = 0xf;
            iVar23 = -1;
            uVar8 = uVar15;
            goto LAB_00108175;
          }
          bVar21 = (iVar31 != 0) << 6;
          pMVar9->beg = MVar22;
          pMVar9->end = uVar12;
          pMVar9->prev = -1;
          pMVar9->next = -1;
          pMVar9->ch = '<';
          pMVar9->flags = bVar21 | 0x34;
          pMVar9 = md_add_mark(ctx);
          if (pMVar9 == (MD_MARK *)0x0) {
            local_118 = (void *)CONCAT44(local_118._4_4_,iVar31);
            uVar15 = uVar15 & 0xffffffff;
            local_134 = MVar24;
            goto LAB_00108a05;
          }
          pMVar9->beg = MVar24 - 1;
          pMVar9->end = MVar24;
          pMVar9->prev = -1;
          pMVar9->next = -1;
          pMVar9->ch = '>';
          pMVar9->flags = bVar21 | 0x38;
          iVar28 = ctx->n_marks;
          pMVar9 = ctx->marks;
          pMVar9[(long)iVar28 + -2].next = iVar28 + -1;
          pMVar9[(long)iVar28 + -1].prev = iVar28 + -2;
          local_118 = (void *)CONCAT44(local_118._4_4_,iVar31);
          local_134 = MVar24;
          goto LAB_00108fab;
        case 0x3d:
        case 0x3e:
        case 0x3f:
          goto switchD_00108272_caseD_5c;
        case 0x40:
switchD_0010835a_caseD_40:
          if (lines_00->beg + 1 <= uVar12) {
            if ((byte)((pMVar4[uVar12 - 1] & 0xdfU) + 0xbf) < 0x1a) {
              if (uVar12 + 3 < uVar6) {
LAB_00108b5a:
                if (((byte)(pMVar4[uVar12 + 1] - 0x30U) < 10) ||
                   ((byte)((pMVar4[uVar12 + 1] & 0xdfU) + 0xbf) < 0x1a)) {
                  pMVar9 = md_add_mark(ctx);
                  if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108a05;
                  pMVar9->beg = uVar12;
                  pMVar9->end = uVar12 + 1;
                  pMVar9->prev = -1;
                  pMVar9->next = -1;
                  pMVar9->ch = bVar21;
                  pMVar9->flags = '\x01';
                  pMVar9 = md_add_mark(ctx);
                  if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108989;
                  MVar22 = lines_00->end;
                  pMVar9->beg = lines_00->beg;
                  pMVar9->end = MVar22;
                  pMVar9->prev = -1;
                  pMVar9->next = -1;
                  pMVar9->ch = 'D';
                  pMVar9->flags = '\0';
                }
              }
            }
            else if ((uVar12 + 3 < uVar6) && ((byte)(pMVar4[uVar12 - 1] - 0x30U) < 10))
            goto LAB_00108b5a;
          }
          break;
        default:
          switch(bVar21) {
          case 0x5b:
            iVar28 = 1;
            goto LAB_00108299;
          case 0x5c:
          case 0x5e:
            goto switchD_00108272_caseD_5c;
          case 0x5d:
            pMVar9 = md_add_mark(ctx);
            if (pMVar9 != (MD_MARK *)0x0) {
              pMVar9->beg = uVar12;
              uVar8 = (ulong)(uVar12 + 1);
              pMVar9->end = uVar12 + 1;
              pMVar9->prev = -1;
              pMVar9->next = -1;
              pMVar9->ch = bVar21;
              pMVar9->flags = '\x02';
              goto LAB_00108dde;
            }
            goto LAB_00108fb5;
          case 0x5f:
switchD_00108272_caseD_5f:
            uVar13 = uVar12 + 1;
            local_168 = (ulong)uVar13;
            if (uVar13 < uVar6) {
              do {
                if (pMVar4[uVar7] != bVar21) {
                  local_168 = uVar7 & 0xffffffff;
                  goto LAB_00108591;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar20);
              local_168 = (ulong)uVar6;
            }
LAB_00108591:
            uVar5 = 0;
            uVar14 = 0;
            if (lines_00->beg != uVar12) {
              uVar14 = md_decode_utf8_before__(ctx,uVar12);
              local_110 = CONCAT44(local_110._4_4_,uVar14);
              iVar28 = md_is_unicode_whitespace__(uVar14);
              uVar5 = 0;
              uVar14 = 0;
              if (iVar28 == 0) {
                iVar28 = md_is_unicode_punct__((MD_OFFSET)local_110);
                uVar5 = (uint)(iVar28 == 0);
                uVar14 = (iVar28 == 0) + 1;
              }
            }
            uVar34 = 0;
            bVar39 = false;
            if ((uint)local_168 != uVar6) {
              local_110 = CONCAT44(local_110._4_4_,uVar14);
              MVar19 = ctx->size - (uint)local_168;
              bVar39 = false;
              local_c8 = CONCAT44(local_c8._4_4_,uVar5);
              uVar6 = md_decode_utf8__(pMVar4 + local_168,MVar19,(MD_SIZE *)0x0);
              iVar28 = md_is_unicode_whitespace__(uVar6);
              uVar34 = 0;
              uVar14 = (MD_OFFSET)local_110;
              uVar5 = (uint)local_c8;
              if (iVar28 == 0) {
                uVar6 = md_decode_utf8__(pMVar4 + local_168,MVar19,(MD_SIZE *)0x0);
                iVar28 = md_is_unicode_punct__(uVar6);
                bVar39 = iVar28 == 0;
                uVar34 = bVar39 + 1;
                uVar14 = (MD_OFFSET)local_110;
                uVar5 = (uint)local_c8;
              }
            }
            if ((bVar21 == 0x5f & (byte)uVar5 & bVar39) != 0) {
              uVar14 = 0;
              uVar34 = 0;
            }
            iVar28 = 5;
            uVar8 = local_168;
            if (uVar14 == 0 && uVar34 == 0) goto LAB_00108175;
            pMVar9 = md_add_mark(ctx);
            if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108a05;
            bVar18 = (uVar34 <= uVar14) * '\x02';
            if (uVar14 == 0) {
              bVar18 = 0;
            }
            bVar18 = (uVar14 <= uVar34 && uVar34 != 0) | bVar18;
            if (bVar18 == 3) {
              bVar18 = 0x23;
            }
            pMVar9->beg = uVar12;
            pMVar9->end = (uint)local_168;
            pMVar9->prev = -1;
            pMVar9->next = -1;
            pMVar9->ch = bVar21;
            pMVar9->flags = ((byte)(((uint)local_168 - uVar12) % 3 << 6) | bVar18) + 0x40;
            if (uVar13 < (uint)local_168) {
              do {
                pMVar9 = md_add_mark(ctx);
                if (pMVar9 == (MD_MARK *)0x0) {
                  uVar15 = (ulong)uVar13;
                  goto LAB_00108a05;
                }
                pMVar9->beg = uVar13;
                pMVar9->end = uVar13;
                pMVar9->prev = -1;
                pMVar9->next = -1;
                pMVar9->ch = 'D';
                pMVar9->flags = '\0';
                uVar13 = uVar13 + 1;
              } while ((uint)local_168 != uVar13);
              goto LAB_00108fab;
            }
            goto LAB_00108fa4;
          case 0x60:
            uVar13 = (uint)local_108 - iVar28;
            uVar7 = (ulong)uVar13;
            do {
              if (pMVar4[uVar15] != '`') {
                bVar39 = pMVar4[uVar15] == ' ';
                goto LAB_00108a1d;
              }
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
            bVar39 = false;
            uVar15 = (ulong)uVar6;
LAB_00108a1d:
            uVar14 = (uint)uVar15;
            uVar5 = uVar14 - uVar12;
            bVar41 = true;
            if (((uVar5 < 0x21) &&
                (codespan_last_potential_closers[uVar5 - 1] < lines_00[uVar13 - 1].end)) &&
               (((int)local_130 == 0 || (uVar14 <= codespan_last_potential_closers[uVar5 - 1])))) {
              local_168 = 0;
              bVar41 = true;
              uVar20 = uVar15 & 0xffffffff;
              uVar34 = uVar6;
              do {
                uVar16 = (ulong)uVar34;
                do {
                  if ((uint)uVar20 < uVar34) {
                    uVar30 = uVar20 & 0xffffffff;
                    do {
                      if (pMVar4[uVar30] != ' ') {
                        if (pMVar4[uVar30] == '`') goto LAB_00108aad;
                        bVar41 = false;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar16 != uVar30);
                    uVar30 = (ulong)uVar34;
                  }
                  else {
                    uVar30 = uVar20 & 0xffffffff;
                  }
LAB_00108aad:
                  uVar35 = (uint)uVar30;
                  uVar20 = uVar30 & 0xffffffff;
                  bVar40 = uVar35 < uVar34;
                  if (bVar40) {
                    bVar40 = true;
                    uVar20 = uVar30 & 0xffffffff;
                    uVar26 = uVar30 & 0xffffffff;
                    if (pMVar4[uVar30 & 0xffffffff] == '`') {
                      do {
                        if (uVar16 - 1 == uVar26) {
                          bVar40 = false;
                          uVar20 = (ulong)uVar34;
                          goto LAB_00108ae8;
                        }
                        uVar20 = uVar26 + 1;
                        lVar11 = uVar26 + 1;
                        uVar26 = uVar20;
                      } while (pMVar4[lVar11] == '`');
                      bVar40 = uVar20 < uVar16;
                    }
                  }
LAB_00108ae8:
                  uVar33 = (uint)uVar20;
                  uVar25 = uVar33 - uVar35;
                  local_110 = uVar7;
                  if (uVar25 == uVar5) {
                    if (lines_00[local_168].beg < uVar35) {
                      bVar40 = pMVar4[uVar35 - 1] == ' ';
                    }
                    else {
                      bVar40 = false;
                    }
                    local_124 = uVar33;
                    local_120 = uVar12;
                    if (((!(bool)(uVar14 != uVar6 & (bVar39 ^ 1U))) && (!bVar41)) &&
                       (uVar35 == lines_00[local_168].beg || bVar40)) {
                      if (bVar39) {
                        uVar14 = uVar14 + 1;
                      }
                      else {
                        uVar14 = lines_00[1].beg;
                      }
                      uVar15 = (ulong)uVar14;
                      if (!bVar40) {
                        uVar20 = (ulong)lines_00[(uint)local_168 - 1].end;
                        local_148 = (ulong)ctx->size;
                        if (lines_00[(uint)local_168 - 1].end < ctx->size) goto LAB_00109300;
                        goto LAB_00109335;
                      }
                      uVar30 = (ulong)(uVar35 - 1);
                    }
                    bVar41 = false;
                    local_148 = uVar30;
                    goto LAB_001091d9;
                  }
                  if ((uVar33 != uVar35) && (bVar41 = false, uVar25 < 0x20)) {
                    uVar33 = codespan_last_potential_closers[(ulong)uVar25 - 1];
                    if (codespan_last_potential_closers[(ulong)uVar25 - 1] < uVar35) {
                      uVar33 = uVar35;
                    }
                    codespan_last_potential_closers[(ulong)uVar25 - 1] = uVar33;
                  }
                } while (bVar40);
                uVar34 = (uint)local_168 + 1;
                local_168 = (ulong)uVar34;
                if (uVar13 <= uVar34) goto LAB_00109402;
                uVar20 = (ulong)lines_00[uVar34].beg;
                uVar34 = lines_00[uVar34].end;
              } while( true );
            }
            goto LAB_001091d9;
          }
          if (uVar14 == 0x2e) {
            if ((lines_00->beg + 3 <= uVar12) &&
               (uVar6 = uVar12 - 3,
               pMVar4[(ulong)uVar6 + 2] == 'w' && *(short *)(pMVar4 + uVar6) == 0x7777)) {
              if (uVar6 != lines_00->beg) {
                uVar13 = md_decode_utf8_before__(ctx,uVar6);
                iVar28 = md_is_unicode_whitespace__(uVar13);
                if ((iVar28 == 0) && (iVar28 = md_is_unicode_punct__(uVar13), iVar28 == 0)) break;
              }
              pMVar9 = md_add_mark(ctx);
              if (pMVar9 != (MD_MARK *)0x0) {
                pMVar9->beg = uVar6;
                uVar6 = uVar12 + 1;
                pMVar9->end = uVar6;
                pMVar9->prev = -1;
                pMVar9->next = -1;
                pMVar9->ch = bVar21;
                pMVar9->flags = '\x01';
                pMVar9 = md_add_mark(ctx);
                if (pMVar9 != (MD_MARK *)0x0) {
                  MVar22 = lines_00->end;
                  pMVar9->beg = lines_00->beg;
                  pMVar9->end = MVar22;
                  goto LAB_00108303;
                }
                goto LAB_00108989;
              }
              goto LAB_00108a05;
            }
            break;
          }
switchD_00108272_caseD_5c:
          if (local_d4 == 0) {
            if ((bVar21 == 0x7c) && (((ctx->parser).flags & 0x2000) != 0)) {
LAB_001088c4:
              pMVar9 = md_add_mark(ctx);
              if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108fb5;
              pMVar9->beg = uVar12;
              uVar8 = (ulong)(uVar12 + 1);
              pMVar9->end = uVar12 + 1;
              pMVar9->prev = -1;
              pMVar9->next = -1;
              pMVar9->ch = bVar21;
              pMVar9->flags = '\0';
              goto LAB_00108dde;
            }
            if (uVar14 < 0x25) {
              uVar16 = (ulong)uVar14;
              if ((0x100001a00U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_001089bf;
              if (uVar16 == 0) goto LAB_00108db4;
              if (uVar16 == 0x24) goto LAB_00108cc2;
            }
            if (uVar14 != 0x7e) {
LAB_00108da4:
              iVar28 = 0;
              uVar8 = (ulong)(uVar12 + 1);
              goto LAB_00108175;
            }
LAB_00108cc2:
            uVar14 = uVar12 + 1;
            uVar13 = uVar14;
            if (uVar14 < uVar6) {
              uVar13 = uVar6;
            }
            uVar8 = uVar15 & 0xffffffff;
            uVar20 = (ulong)uVar14;
            do {
              uVar14 = (uint)uVar20;
              if (uVar6 <= uVar14) {
                uVar8 = (ulong)uVar13;
                break;
              }
              uVar8 = (ulong)((int)uVar8 + 1);
              pbVar27 = (byte *)(pMVar4 + uVar20);
              uVar20 = uVar20 + 1;
            } while (*pbVar27 == bVar21);
            MVar22 = (MD_OFFSET)uVar8;
            iVar28 = 5;
            if (2 < MVar22 - uVar12) goto LAB_00108175;
            uVar13 = 3;
            if (lines_00->beg < uVar12) {
              uVar5 = md_decode_utf8_before__(ctx,uVar12);
              local_110 = CONCAT44(local_110._4_4_,uVar5);
              iVar28 = md_is_unicode_whitespace__(uVar5);
              if (iVar28 == 0) {
                iVar28 = md_is_unicode_punct__((MD_OFFSET)local_110);
                uVar13 = 3 - (iVar28 == 0);
              }
            }
            if (uVar14 < uVar6) {
              MVar19 = ctx->size - MVar22;
              uVar6 = md_decode_utf8__(pMVar4 + uVar8,MVar19,(MD_SIZE *)0x0);
              iVar28 = md_is_unicode_whitespace__(uVar6);
              if (iVar28 == 0) {
                uVar6 = md_decode_utf8__(pMVar4 + uVar8,MVar19,(MD_SIZE *)0x0);
                iVar28 = md_is_unicode_punct__(uVar6);
                if (iVar28 == 0) {
                  uVar13 = uVar13 & 1;
                }
              }
            }
            bVar39 = true;
            if (uVar13 == 0) {
              iVar28 = 0;
            }
            else {
              pMVar9 = md_add_mark(ctx);
              iVar28 = 0;
              if (pMVar9 == (MD_MARK *)0x0) {
                iVar23 = -1;
                iVar28 = 0xf;
                bVar39 = false;
              }
              else {
                pMVar9->beg = uVar12;
                pMVar9->end = MVar22;
                pMVar9->prev = -1;
                pMVar9->next = -1;
                pMVar9->ch = bVar21;
                pMVar9->flags = (uchar)uVar13;
              }
            }
            uVar13 = uVar12;
            if (bVar39) {
              iVar28 = 5;
              uVar13 = MVar22;
            }
          }
          else {
            if (0x24 < uVar13) {
LAB_00108896:
              if (uVar14 != 0x7e) {
                if (uVar14 != 0x7c) goto LAB_00108da4;
                goto LAB_001088c4;
              }
              goto LAB_00108cc2;
            }
            uVar16 = (ulong)uVar13;
            if ((0x100001a00U >> (uVar16 & 0x3f) & 1) == 0) {
              if (uVar16 == 0) {
LAB_00108db4:
                pMVar9 = md_add_mark(ctx);
                if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108fb5;
                pMVar9->beg = uVar12;
                uVar8 = (ulong)(uVar12 + 1);
                pMVar9->end = uVar12 + 1;
                pMVar9->prev = -1;
                pMVar9->next = -1;
                pMVar9->ch = bVar21;
                pMVar9->flags = '\x10';
                goto LAB_00108dde;
              }
              if (uVar16 == 0x24) goto LAB_00108cc2;
              goto LAB_00108896;
            }
LAB_001089bf:
            uVar13 = uVar12 + 1;
            if (uVar12 + 1 < uVar6) {
              do {
                if ((0x20 < (ulong)(byte)pMVar4[uVar7]) ||
                   ((0x100001a00U >> ((ulong)(byte)pMVar4[uVar7] & 0x3f) & 1) == 0)) {
                  uVar13 = (uint)uVar7;
                  break;
                }
                uVar7 = uVar7 + 1;
                uVar13 = uVar6;
              } while (uVar7 < uVar20);
            }
            iVar28 = 5;
            if ((bVar21 != 0x20) || (1 < uVar13 - uVar12)) {
              pMVar9 = md_add_mark(ctx);
              if (pMVar9 == (MD_MARK *)0x0) goto LAB_00108fb5;
              pMVar9->beg = uVar12;
              pMVar9->end = uVar13;
              pMVar9->prev = -1;
              pMVar9->next = -1;
              pMVar9->ch = bVar21;
              pMVar9->flags = '\x10';
LAB_00108fa4:
              local_168 = (ulong)uVar13;
              goto LAB_00108fab;
            }
          }
          uVar8 = (ulong)uVar13;
          goto LAB_00108175;
        }
        local_168 = (ulong)(uVar12 + 1);
      }
      goto LAB_00108fab;
    }
    uVar8 = (ulong)uVar12;
    goto LAB_00108175;
  }
  iVar23 = 0;
LAB_00109671:
  pMVar9 = md_add_mark(ctx);
  if (pMVar9 == (MD_MARK *)0x0) {
    iVar23 = -1;
  }
  else {
    MVar22 = ctx->size;
    pMVar9->beg = MVar22;
    pMVar9->end = MVar22;
    pMVar9->prev = -1;
    pMVar9->next = -1;
    pMVar9->ch = '\x7f';
    pMVar9->flags = '\x10';
  }
LAB_001096a1:
  if (-1 < iVar23) {
    iVar28 = 0x10d960;
    iVar23 = 0;
    md_analyze_marks(ctx,lines,0,ctx->n_marks,0x10d960,(MD_CHAR *)0x0,in_stack_fffffffffffffe88);
    uVar8 = (ulong)(uint)ctx->unresolved_link_head;
    if (ctx->unresolved_link_head < 0) {
      bVar39 = false;
    }
    else {
      local_c0 = (MD_OFFSET *)CONCAT44(local_c0._4_4_,(int)local_108 + -1);
      uVar6 = 0;
      uVar12 = 0;
      uVar13 = 0;
      local_f0 = local_f0 & 0xffffffff00000000;
      do {
        pMVar9 = ctx->marks;
        uVar7 = uVar8 & 0xffffffff;
        local_110 = uVar7 * 5;
        uVar20 = (ulong)pMVar9[uVar7].prev;
        if ((long)uVar20 < 0) {
          pMVar38 = (MD_MARK *)0x0;
          local_158 = (MD_MARK *)0x0;
        }
        else {
          pMVar38 = pMVar9 + uVar20;
          local_158 = pMVar9 + pMVar38->next;
        }
        pMVar1 = pMVar9 + uVar7;
        uVar14 = pMVar1->next;
        uVar7 = (ulong)uVar14;
        local_c8 = (long)(int)uVar14 * 5;
        pMVar2 = pMVar9 + (int)uVar14;
        uVar5 = pMVar1->beg;
        iVar28 = (int)pMVar2;
        if ((((uVar5 < uVar6) && (pMVar2->end < uVar12)) ||
            ((uVar5 < uVar13 && (pMVar2->end < (uint)local_f0)))) ||
           ((uVar5 < uVar12 && (pMVar1->ch == '[')))) {
LAB_00109de4:
          bVar39 = false;
          uVar8 = uVar20 & 0xffffffff;
        }
        else {
          iVar36 = 0;
          iVar31 = 0;
          local_140 = uVar8;
          iVar23 = iVar36;
          pMVar29 = pMVar2;
          if ((((ctx->parser).flags & 0x2000) != 0) && (pMVar38 != (MD_MARK *)0x0)) {
            uVar34 = pMVar1->end;
            uVar15 = (ulong)uVar34;
            iVar23 = iVar31;
            if (((((uVar34 - uVar5 != 1) || (pMVar38->ch != '[')) || (pMVar38->beg != uVar5 - 1)) ||
                ((pMVar38->end - pMVar38->beg != 1 || (iVar23 = iVar36, local_158 == (MD_MARK *)0x0)
                 ))) || (iVar23 = iVar31, local_158->ch != ']')) goto LAB_00109929;
            uVar5 = pMVar2->beg;
            local_130 = uVar7;
            if ((local_158->beg != uVar5 + 1) || (local_158->end - local_158->beg != 1))
            goto LAB_00109929;
            local_e0 = (MD_MARK *)&pMVar1->end;
            iVar36 = (int)uVar8;
            iVar31 = iVar36 + 1;
            local_f8 = (MD_MARK *)0x0;
            do {
              if ((int)uVar14 <= iVar31) break;
              if (pMVar9[iVar31].ch == 'D') {
LAB_001098ab:
                iVar31 = iVar31 + 1;
                bVar39 = true;
              }
              else {
                pMVar17 = pMVar9 + iVar31;
                if (pMVar9[iVar31].ch == '|') {
                  bVar39 = false;
                  local_f8 = pMVar17;
                }
                else {
                  if (pMVar17->beg - uVar34 < 0x65) {
                    if ((pMVar17->flags & 4) != 0) {
                      iVar31 = pMVar17->next;
                    }
                    goto LAB_001098ab;
                  }
                  bVar39 = false;
                }
              }
            } while (bVar39);
            pMVar17 = local_f8;
            if (local_f8 == (MD_MARK *)0x0) {
              pMVar17 = pMVar2;
            }
            uVar35 = pMVar17->beg;
            if ((uVar35 == uVar34) || (100 < uVar35 - uVar34)) {
LAB_0010a21b:
              iVar23 = 0;
              uVar8 = CONCAT71((int7)(uVar15 >> 8),1);
            }
            else {
              iVar23 = 1;
              if (uVar34 < uVar35) {
                do {
                  if ((ctx->text[uVar15] == '\n') || (ctx->text[uVar15] == '\r')) goto LAB_0010a21b;
                  uVar15 = uVar15 + 1;
                } while (uVar35 != uVar15);
                uVar8 = 0;
              }
              else {
                uVar8 = 0;
              }
            }
            if ((char)uVar8 == '\0') {
              local_e8 = (MD_OFFSET *)CONCAT44(local_e8._4_4_,(int)uVar8);
              if (local_f8 == (MD_MARK *)0x0) {
                bVar39 = true;
              }
              else {
                bVar41 = local_f8->end < uVar5;
                bVar39 = !bVar41;
                if (bVar41) {
                  md_rollback(ctx,iVar36,iVar31,1);
                  lVar11 = 0;
                  do {
                    uVar6 = ctx->opener_stacks[lVar11].top;
                    while (iVar31 <= (int)uVar6) {
                      if (-1 < (int)uVar6) {
                        uVar6 = ctx->marks[uVar6].next;
                        ctx->opener_stacks[lVar11].top = uVar6;
                      }
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 != 0x10);
                  local_f8->flags = local_f8->flags | 0x10;
                  pMVar17 = local_e0;
                }
                else {
                  md_rollback(ctx,iVar36,uVar14,1);
                  pMVar17 = pMVar2;
                }
                pMVar17->beg = local_f8->beg;
              }
              uVar6 = pMVar38->beg;
              pMVar1->beg = uVar6;
              pMVar1->next = (int)local_130;
              pMVar1->flags = pMVar1->flags | 0x14;
              uVar12 = local_158->end;
              pMVar2->end = uVar12;
              pMVar2->prev = iVar36;
              pMVar2->flags = pMVar2->flags | 0x18;
              if (!bVar39) {
                md_analyze_link_contents(ctx,lines,iVar31 + 1,(int)local_130,iVar28);
              }
              local_140 = (ulong)(uint)pMVar38->prev;
              uVar8 = (ulong)local_e8 & 0xffffffff;
            }
            bVar39 = false;
            uVar7 = local_130;
            if ((char)uVar8 != '\0') goto LAB_00109929;
LAB_0010a132:
            iVar28 = (int)pMVar29;
            uVar8 = local_140;
            goto LAB_00109de6;
          }
LAB_00109929:
          uVar8 = uVar20;
          if (pMVar38 == (MD_MARK *)0x0) {
LAB_0010997c:
            uVar14 = pMVar2->end;
            uVar5 = ctx->size;
            uVar20 = (ulong)uVar5;
            if ((uVar14 < uVar5) && (pMVar4 = ctx->text, pMVar4[uVar14] == '(')) {
              uVar35 = 0;
              uVar34 = (uint)local_c0;
              do {
                uVar33 = uVar34 + uVar35 >> 1;
                uVar15 = (ulong)uVar33;
                if (uVar14 < lines[uVar15].beg) {
                  if ((uVar34 == 0) || (lines[uVar34 - 1].end < uVar14)) goto LAB_001099eb;
                  uVar34 = uVar33 - 1;
                }
                else {
                  if (uVar14 <= lines[uVar15].end) goto LAB_001099eb;
                  uVar35 = uVar33 + 1;
                }
              } while (uVar35 <= uVar34);
              uVar15 = 0;
LAB_001099eb:
              uVar34 = lines[uVar15].end;
              uVar14 = uVar14 + 1;
              uVar32 = (uint7)(uint3)(uVar5 >> 8);
              local_138 = uVar14;
              local_130 = uVar7;
              if (uVar14 < uVar34) {
                bVar39 = true;
                uVar16 = (ulong)uVar14;
                do {
                  if ((0x20 < (ulong)(byte)pMVar4[uVar16]) ||
                     ((0x100001a00U >> ((ulong)(byte)pMVar4[uVar16] & 0x3f) & 1) == 0)) {
                    local_138 = uVar14;
                    if (bVar39) goto LAB_00109b7f;
                    break;
                  }
                  bVar39 = uVar16 + 1 < (ulong)uVar34;
                  uVar14 = uVar14 + 1;
                  local_138 = uVar34;
                  uVar16 = uVar16 + 1;
                } while (uVar34 != uVar14);
              }
              if (((local_138 < uVar5) && (pMVar4[local_138] != '\r')) &&
                 (pMVar4[local_138] != '\n')) {
LAB_00109b7f:
                if ((local_138 < uVar5) && (pMVar4[local_138] == ')')) {
                  codespan_last_potential_closers[1] = local_138;
                  codespan_last_potential_closers[0] = local_138;
                  local_138 = local_138 + 1;
                  pMVar38 = (MD_MARK *)(ulong)local_138;
                  codespan_last_potential_closers[2] = 0;
                  codespan_last_potential_closers[3] = 0;
                  codespan_last_potential_closers[4] = 0;
                  codespan_last_potential_closers[5] = 0;
                  iVar23 = 1;
                  uVar20 = CONCAT71(uVar32,1);
                  bVar39 = false;
                }
                else {
                  iVar36 = (int)uVar15;
                  p_size = (MD_SIZE *)0x109c05;
                  iVar31 = md_is_link_destination
                                     (ctx,local_138,lines[uVar15].end,&local_138,
                                      codespan_last_potential_closers,
                                      codespan_last_potential_closers + 1);
                  iVar23 = 0;
                  uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
                  if (iVar31 == 0) {
                    bVar39 = true;
                    pMVar38 = (MD_MARK *)0xffffffff;
                    uVar7 = local_130;
                  }
                  else {
                    iVar23 = md_is_link_title(ctx,lines + uVar15,(int)local_108 - iVar36,local_138,
                                              &local_138,&title_contents_line_index,&tmp_line_index,
                                              &title_contents_beg,&title_contents_end);
                    MVar19 = title_contents_line_index;
                    uVar7 = local_130;
                    if (iVar23 == 0) {
                      title_contents_beg = local_138;
                      title_contents_end = local_138;
                      title_contents_line_index = 0;
                    }
                    else {
                      title_contents_line_index = title_contents_line_index + iVar36;
                      uVar15 = (ulong)(tmp_line_index + iVar36);
                    }
                    pMVar38 = (MD_MARK *)0xffffffff;
                    uVar14 = lines[uVar15].end;
                    uVar16 = (ulong)local_138;
                    uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
                    if (local_138 < uVar14) {
                      bVar39 = true;
                      do {
                        if ((0x20 < (ulong)(byte)pMVar4[uVar16]) ||
                           ((0x100001a00U >> ((ulong)(byte)pMVar4[uVar16] & 0x3f) & 1) == 0)) {
                          local_138 = (uint)uVar16;
                          if (bVar39) goto LAB_00109f77;
                          break;
                        }
                        uVar16 = uVar16 + 1;
                        bVar39 = uVar16 < uVar14;
                        local_138 = uVar14;
                      } while (uVar16 != uVar14);
                    }
                    uVar14 = (int)uVar15 + 1;
                    if (uVar14 < (uint)local_108) {
                      local_138 = lines[uVar14].beg;
LAB_00109f77:
                      if (pMVar4[local_138] == ')') {
                        local_138 = local_138 + 1;
                        pMVar38 = (MD_MARK *)(ulong)local_138;
                        if (title_contents_beg < title_contents_end) {
                          if (iVar23 != 0 && tmp_line_index != MVar19) {
                            iVar23 = md_merge_lines_alloc
                                               (ctx,title_contents_beg,title_contents_end,
                                                lines + title_contents_line_index,10,
                                                (char)codespan_last_potential_closers + '\b',
                                                (MD_CHAR **)(codespan_last_potential_closers + 4),
                                                p_size);
                            if (iVar23 < 0) {
                              pMVar38 = (MD_MARK *)0xffffffff;
                              uVar20 = 0;
                              bVar39 = false;
                              iVar23 = -1;
                            }
                            else {
                              codespan_last_potential_closers[5] = 1;
                              iVar23 = 1;
                              bVar39 = false;
                              uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
                            }
                            goto LAB_0010a02a;
                          }
                          codespan_last_potential_closers._8_8_ = pMVar4 + title_contents_beg;
                          codespan_last_potential_closers[4] =
                               title_contents_end - title_contents_beg;
                        }
                        else {
                          codespan_last_potential_closers[2] = 0;
                          codespan_last_potential_closers[3] = 0;
                          codespan_last_potential_closers[4] = 0;
                        }
                        codespan_last_potential_closers[5] = 0;
                        iVar23 = 1;
                        bVar39 = false;
                        goto LAB_0010a02a;
                      }
                    }
                    bVar39 = true;
                    iVar23 = 0;
                  }
                }
              }
              else {
                uVar14 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar14;
                if (uVar14 < (uint)local_108) {
                  local_138 = lines[uVar14].beg;
                  goto LAB_00109b7f;
                }
                iVar23 = 0;
                uVar20 = CONCAT71(uVar32,1);
                pMVar38 = (MD_MARK *)0xffffffff;
                bVar39 = true;
              }
LAB_0010a02a:
              if ((char)uVar20 != '\0') {
                local_f8 = (MD_MARK *)CONCAT44(local_f8._4_4_,(int)uVar20);
                iVar31 = 0;
                if (!bVar39) {
                  iVar36 = (int)uVar7 + 1;
                  local_118 = (void *)codespan_last_potential_closers._8_8_;
                  local_e8 = (MD_OFFSET *)
                             CONCAT44(local_e8._4_4_,codespan_last_potential_closers[5]);
                  MVar22 = codespan_last_potential_closers[5];
                  local_e0 = pMVar38;
                  do {
                    iVar31 = iVar23;
                    if (ctx->n_marks <= iVar36) break;
                    pMVar29 = ctx->marks;
                    if (pMVar29[iVar36].beg < (uint)pMVar38) {
                      iVar31 = iVar36;
                      if (((~pMVar29[iVar36].flags & 0x14) == 0) &&
                         (iVar31 = pMVar29[iVar36].next,
                         (uint)pMVar38 <= pMVar29[pMVar29[iVar36].next].beg)) {
                        if (MVar22 != 0) {
                          free(local_118);
                          pMVar38 = local_e0;
                          MVar22 = (MD_OFFSET)local_e8;
                        }
                        iVar23 = 0;
                        bVar39 = false;
                      }
                      else {
                        iVar36 = iVar31 + 1;
                        bVar39 = true;
                      }
                    }
                    else {
                      bVar39 = false;
                    }
                    iVar31 = iVar23;
                  } while (bVar39);
                }
                iVar23 = iVar31;
                if (iVar23 != 0) {
                  pMVar2->end = (MD_OFFSET)pMVar38;
                }
                uVar20 = (ulong)local_f8 & 0xffffffff;
              }
              bVar39 = true;
              pMVar29 = pMVar2;
              if ((char)uVar20 == '\0') goto LAB_0010a132;
            }
            if (iVar23 == 0) {
              iVar23 = 0;
              if ((pMVar1->flags & 0x20) == 0) {
                iVar23 = md_is_link_reference
                                   (ctx,lines,(MD_SIZE)local_108,pMVar1->beg,pMVar2->end,
                                    (MD_LINK_ATTR *)codespan_last_potential_closers);
              }
              pMVar29 = pMVar2;
              if (iVar23 < 0) goto LAB_00109b37;
            }
          }
          else {
            uVar14 = pMVar38->beg;
            uVar5 = pMVar2->end;
            pMVar29 = (MD_MARK *)(ulong)uVar5;
            if (uVar14 != uVar5) goto LAB_0010997c;
            if (uVar5 + 1 < local_158->beg) {
              if ((pMVar38->flags & 0x20) == 0) {
                pMVar29 = (MD_MARK *)(ulong)local_158->end;
LAB_00109adb:
                iVar23 = md_is_link_reference
                                   (ctx,lines,(uint)local_108,uVar14,(MD_OFFSET)pMVar29,
                                    (MD_LINK_ATTR *)codespan_last_potential_closers);
              }
            }
            else if ((pMVar1->flags & 0x20) == 0) {
              uVar14 = pMVar1->beg;
              goto LAB_00109adb;
            }
            if (iVar23 < 0) {
LAB_00109b37:
              bVar39 = true;
              goto LAB_0010a132;
            }
            if (iVar23 == 0) {
              iVar23 = 0;
            }
            else {
              pMVar2->end = local_158->end;
              iVar23 = 1;
              uVar8 = (ulong)(uint)ctx->marks[uVar20].prev;
            }
          }
          bVar39 = false;
          uVar20 = uVar8;
          if (iVar23 == 0) goto LAB_00109de4;
          pMVar1->flags = pMVar1->flags | 0x14;
          pMVar2->flags = pMVar2->flags | 0x18;
          pMVar29 = ctx->marks;
          MVar19 = (int)local_140 + 1;
          pMVar38 = pMVar29 + (int)MVar19;
          pMVar38->beg = codespan_last_potential_closers[0];
          pMVar38->end = codespan_last_potential_closers[1];
          iVar28 = (int)local_140 + 2;
          pMVar29 = pMVar29 + iVar28;
          pMVar29->beg = codespan_last_potential_closers[2];
          pMVar29->end = codespan_last_potential_closers[3];
          if (codespan_last_potential_closers[5] != 0) {
            ctx->marks[iVar28].next = (ctx->ptr_stack).top;
            (ctx->ptr_stack).top = iVar28;
          }
          ctx->marks[iVar28].prev = codespan_last_potential_closers[4];
          bVar41 = pMVar1->ch != '[';
          uVar14 = (uint)local_f0;
          if (bVar41) {
            uVar14 = pMVar2->end;
          }
          local_f0 = CONCAT44(local_f0._4_4_,uVar14);
          uVar14 = pMVar1->beg;
          if (!bVar41) {
            uVar6 = pMVar1->beg;
            uVar14 = uVar13;
            uVar12 = pMVar2->end;
          }
          uVar13 = uVar14;
          md_analyze_link_contents(ctx,lines,MVar19,(int)uVar7,iVar28);
          if (((ctx->parser).flags & 0x40c) == 0) {
LAB_00109e82:
            uVar8 = uVar8 & 0xffffffff;
          }
          else {
            pMVar38 = (MD_MARK *)(&pMVar9->beg + local_110);
            do {
              pMVar29 = pMVar38;
              pMVar38 = pMVar29 + 1;
              cVar3 = pMVar29[1].ch;
              if (cVar3 != 0x44) break;
            } while (pMVar38 < pMVar2);
            pMVar37 = &pMVar9->beg + local_c8;
            pMVar9 = (MD_MARK *)(&pMVar9->beg + local_c8);
            do {
              pMVar17 = pMVar9;
              pMVar37 = pMVar37 + -5;
              if (cVar3 != 'D') break;
              pMVar9 = pMVar17 + -1;
            } while (pMVar1 < pMVar17 + -1);
            bVar21 = pMVar29[1].flags;
            if ((((bVar21 & 0x10) != 0) && (cVar3 != '\0')) && (pMVar38->beg == pMVar1->end)) {
              pvVar10 = memchr("@:.",(int)cVar3,4);
              if (pvVar10 == (void *)0x0) goto LAB_00109e82;
              if ((((long)pMVar37 - (long)ctx->marks >> 2) * -0x3333333333333333 -
                   (long)pMVar29[1].next == 0) && (pMVar17[-1].end == pMVar2->beg)) {
                pMVar29[1].ch = 'D';
                pMVar29[1].flags = bVar21 & 0xef;
                pMVar17[-1].ch = 'D';
                pMVar17[-1].flags = pMVar17[-1].flags & 0xef;
              }
            }
          }
        }
LAB_00109de6:
        if (bVar39) {
          iVar23 = -1;
          bVar39 = true;
          goto LAB_0010a3a9;
        }
      } while (-1 < (int)uVar8);
      bVar39 = false;
      iVar23 = 0;
    }
LAB_0010a3a9:
    if (!bVar39) {
      ctx->opener_stacks[0xe].top = -1;
      ctx->unresolved_link_head = -1;
      ctx->unresolved_link_tail = -1;
      if (local_d4 == 0) {
        md_analyze_link_contents(ctx,lines,0,ctx->n_marks,iVar28);
      }
      else {
        ctx->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx,lines,0,ctx->n_marks,0x10d964,(MD_CHAR *)0x0,in_stack_fffffffffffffe88)
        ;
      }
    }
  }
  return iVar23;
  while( true ) {
    uVar20 = uVar20 + 1;
    bVar41 = false;
    if (local_148 == uVar20) break;
LAB_00109300:
    if ((pMVar4[uVar20] != ' ') && (pMVar4[uVar20] != '\t')) goto LAB_00109335;
  }
LAB_001091d9:
  iVar28 = 5;
  if (bVar41) {
    uVar8 = uVar15 & 0xffffffff;
  }
  else {
    pMVar9 = md_add_mark(ctx);
    if (pMVar9 != (MD_MARK *)0x0) {
      pMVar9->beg = local_120;
      pMVar9->end = (MD_OFFSET)uVar15;
      pMVar9->prev = -1;
      pMVar9->next = -1;
      pMVar9->ch = '`';
      pMVar9->flags = '\x01';
      pMVar9 = md_add_mark(ctx);
      if (pMVar9 != (MD_MARK *)0x0) {
        pMVar9->beg = (MD_OFFSET)local_148;
        pMVar9->end = local_124;
        pMVar9->prev = -1;
        pMVar9->next = -1;
        pMVar9->ch = '`';
        pMVar9->flags = '\x02';
        iVar28 = ctx->n_marks;
        pMVar9 = ctx->marks;
        pMVar9[(long)iVar28 + -2].next = iVar28 + -1;
        pMVar9[(long)iVar28 + -1].prev = iVar28 + -2;
        pMVar9[(long)iVar28 + -2].flags = pMVar9[(long)iVar28 + -2].flags | 0x14;
        pMVar9[(long)iVar28 + -1].flags = pMVar9[(long)iVar28 + -1].flags | 0x18;
        pMVar9 = local_158;
        if (lines_00->end < local_124) {
          uVar6 = 0;
          uVar8 = local_f0;
          do {
            iVar28 = (int)uVar8;
            uVar12 = iVar28 + uVar6 >> 1;
            pMVar9 = (MD_MARK *)(ulong)uVar12;
            lines_00 = lines + (long)pMVar9;
            if (local_124 < lines_00->beg) {
              if ((iVar28 == 0) || (lines[iVar28 - 1].end < local_124)) goto LAB_001092d7;
              uVar8 = (ulong)(uVar12 - 1);
            }
            else {
              if (local_124 <= lines_00->end) goto LAB_001092d7;
              uVar6 = uVar12 + 1;
            }
          } while (uVar6 <= (uint)uVar8);
          local_168 = (ulong)local_124;
          lines_00 = (MD_LINE *)0x0;
        }
        else {
LAB_001092d7:
          local_158 = pMVar9;
          local_168 = (ulong)local_124;
        }
LAB_00108fab:
        iVar28 = 5;
        uVar8 = local_168;
        goto LAB_00108175;
      }
    }
    iVar28 = 0xf;
    iVar23 = -1;
  }
LAB_00108175:
  if ((iVar28 == 0) || (iVar28 == 5)) goto LAB_00108074;
  if (iVar28 != 6) goto LAB_001096a1;
  uVar6 = (int)local_158 + 1;
  local_158 = (MD_MARK *)(ulong)uVar6;
  if ((uint)local_108 <= uVar6) goto LAB_00109671;
  goto LAB_00108061;
LAB_00109335:
  local_148 = uVar20;
  bVar41 = false;
  goto LAB_001091d9;
LAB_00109402:
  local_130 = CONCAT44(local_130._4_4_,1);
  bVar41 = true;
  goto LAB_001091d9;
LAB_00109121:
  local_168 = (ulong)uVar14;
  bVar21 = pMVar4[uVar8];
  uVar20 = (ulong)bVar21;
  if (uVar20 < 0x3f) {
    if ((0x100001a00U >> (uVar20 & 0x3f) & 1) != 0) goto LAB_00109428;
    if (uVar20 == 0x3e) {
      iVar31 = 0;
      bVar41 = false;
      if (bVar39) goto LAB_00109565;
      goto LAB_00109428;
    }
  }
  if (((bVar21 < 0x20) || (bVar21 == 0x3c)) || (bVar21 == 0x7f)) goto LAB_00109428;
  uVar8 = uVar8 + 1;
  uVar14 = uVar14 + 1;
  bVar39 = uVar8 < uVar6;
  if (!bVar39) goto LAB_00109428;
  goto LAB_00109121;
}

Assistant:

static int
md_analyze_inlines(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, int table_mode)
{
    int ret;

    /* Reset the previously collected stack of marks. */
    ctx->n_marks = 0;

    /* Collect all marks. */
    MD_CHECK(md_collect_marks(ctx, lines, n_lines, table_mode));

    /* (1) Links. */
    md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("[]!"), 0);
    MD_CHECK(md_resolve_links(ctx, lines, n_lines));
    BRACKET_OPENERS.top = -1;
    ctx->unresolved_link_head = -1;
    ctx->unresolved_link_tail = -1;

    if(table_mode) {
        /* (2) Analyze table cell boundaries. */
        MD_ASSERT(n_lines == 1);
        ctx->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("|"), 0);
        return ret;
    }

    /* (3) Emphasis and strong emphasis; permissive autolinks. */
    md_analyze_link_contents(ctx, lines, n_lines, 0, ctx->n_marks);

abort:
    return ret;
}